

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

int pybind11_object_init(PyObject *self,PyObject *param_2,PyObject *param_3)

{
  PyTypeObject *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  string local_48 [8];
  string msg;
  PyTypeObject *type;
  PyObject *param_2_local;
  PyObject *param_1_local;
  PyObject *self_local;
  
  pPVar1 = self->ob_type;
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::operator+=(local_48,pPVar1->tp_name);
  std::__cxx11::string::operator+=(local_48,": No constructor defined!");
  uVar2 = _PyExc_TypeError;
  uVar3 = std::__cxx11::string::c_str();
  PyErr_SetString(uVar2,uVar3);
  std::__cxx11::string::~string(local_48);
  return -1;
}

Assistant:

inline int pybind11_object_init(PyObject *self, PyObject *, PyObject *) {
    PyTypeObject *type = Py_TYPE(self);
    std::string msg;
#if defined(PYPY_VERSION)
    msg += handle((PyObject *) type).attr("__module__").cast<std::string>() + ".";
#endif
    msg += type->tp_name;
    msg += ": No constructor defined!";
    PyErr_SetString(PyExc_TypeError, msg.c_str());
    return -1;
}